

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<unsigned_long>::Resize
          (RepeatedField<unsigned_long> *this,int new_size,unsigned_long *value)

{
  unsigned_long uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  LogMessage *other;
  unsigned_long *puVar4;
  unsigned_long *puVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  LogFinisher local_69;
  LogMessage local_68;
  
  if (new_size < 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x275);
    other = internal::LogMessage::operator<<(&local_68,"CHECK failed: (new_size) >= (0): ");
    internal::LogFinisher::operator=(&local_69,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if (this->current_size_ < new_size) {
    Reserve(this,new_size);
    puVar4 = elements(this);
    lVar8 = (long)this->current_size_;
    puVar5 = elements(this);
    auVar3 = _DAT_003dea10;
    auVar2 = _DAT_003dea00;
    if (puVar4 + lVar8 != puVar5 + new_size) {
      uVar1 = *value;
      uVar6 = (long)(puVar5 + new_size) + (-8 - (long)(puVar4 + lVar8));
      auVar11._8_4_ = (int)uVar6;
      auVar11._0_8_ = uVar6;
      auVar11._12_4_ = (int)(uVar6 >> 0x20);
      auVar9._0_8_ = uVar6 >> 3;
      auVar9._8_8_ = auVar11._8_8_ >> 3;
      uVar7 = 0;
      auVar9 = auVar9 ^ _DAT_003dea10;
      do {
        auVar10._8_4_ = (int)uVar7;
        auVar10._0_8_ = uVar7;
        auVar10._12_4_ = (int)(uVar7 >> 0x20);
        auVar11 = (auVar10 | auVar2) ^ auVar3;
        if ((bool)(~(auVar11._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar11._0_4_ ||
                    auVar9._4_4_ < auVar11._4_4_) & 1)) {
          puVar4[lVar8 + uVar7] = uVar1;
        }
        if ((auVar11._12_4_ != auVar9._12_4_ || auVar11._8_4_ <= auVar9._8_4_) &&
            auVar11._12_4_ <= auVar9._12_4_) {
          puVar4[lVar8 + uVar7 + 1] = uVar1;
        }
        uVar7 = uVar7 + 2;
      } while (((uVar6 >> 3) + 2 & 0xfffffffffffffffe) != uVar7);
    }
  }
  this->current_size_ = new_size;
  return;
}

Assistant:

inline void RepeatedField<Element>::Resize(int new_size, const Element& value) {
  GOOGLE_DCHECK_GE(new_size, 0);
  if (new_size > current_size_) {
    Reserve(new_size);
    std::fill(&elements()[current_size_], &elements()[new_size], value);
  }
  current_size_ = new_size;
}